

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O2

void __thiscall MidiInApi::~MidiInApi(MidiInApi *this)

{
  MidiMessage *pMVar1;
  double dVar2;
  long lVar3;
  
  (this->super_MidiApi)._vptr_MidiApi = (_func_int **)&PTR__MidiInApi_00115af0;
  if (((this->inputData_).queue.ringSize != 0) &&
     (pMVar1 = (this->inputData_).queue.ring, pMVar1 != (MidiMessage *)0x0)) {
    dVar2 = pMVar1[-1].timeStamp;
    if (dVar2 != 0.0) {
      lVar3 = (long)dVar2 << 5;
      do {
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
                   ((long)&pMVar1[-1].bytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start + lVar3));
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != 0);
    }
    operator_delete__(&pMVar1[-1].timeStamp,(long)dVar2 << 5 | 8);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)
             &(this->inputData_).message);
  MidiOutApi::~MidiOutApi((MidiOutApi *)this);
  return;
}

Assistant:

MidiInApi :: ~MidiInApi( void )
{
  // Delete the MIDI queue.
  if ( inputData_.queue.ringSize > 0 ) delete [] inputData_.queue.ring;
}